

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  cmMakefile *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_2b8;
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  cmMakefile *local_30;
  char *featuresKnown;
  string *error_local;
  string *lang_local;
  cmMakefile *this_local;
  
  featuresKnown = (char *)error;
  error_local = lang;
  lang_local = (string *)this;
  std::operator+(&local_70,"CMAKE_",lang);
  std::operator+(&local_50,&local_70,"_COMPILE_FEATURES");
  pcVar1 = (cmMakefile *)GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if ((pcVar1 == (cmMakefile *)0x0) ||
     (this_local = pcVar1, *(char *)&(pcVar1->CMP0054ReportedIds)._M_t._M_impl == '\0')) {
    local_30 = pcVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    if (featuresKnown == (char *)0x0) {
      std::operator<<((ostream *)local_1f8,"No");
    }
    else {
      std::operator<<((ostream *)local_1f8,"no");
    }
    poVar2 = std::operator<<((ostream *)local_1f8," known features for ");
    poVar2 = std::operator<<(poVar2,(string *)error_local);
    poVar2 = std::operator<<(poVar2," compiler\n\"");
    std::operator+(&local_238,"CMAKE_",error_local);
    std::operator+(&local_218,&local_238,"_COMPILER_ID");
    pcVar3 = GetDefinition(this,&local_218);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"\"\nversion ");
    std::operator+(&local_278,"CMAKE_",error_local);
    std::operator+(&local_258,&local_278,"_COMPILER_VERSION");
    pcVar3 = GetDefinition(this,&local_258);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,".");
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    if (featuresKnown == (char *)0x0) {
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_2b8,false);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    else {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)featuresKnown,local_298);
      std::__cxx11::string::~string(local_298);
    }
    this_local = (cmMakefile *)0x0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  }
  return (char *)this_local;
}

Assistant:

const char* cmMakefile::
CompileFeaturesAvailable(const std::string& lang, std::string *error) const
{
  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown)
    {
    std::ostringstream e;
    if (error)
      {
      e << "no";
      }
    else
      {
      e << "No";
      }
    e << " known features for " << lang << " compiler\n\""
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error)
      {
      *error = e.str();
      }
    else
      {
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    return 0;
    }
  return featuresKnown;
}